

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pybind11.h
# Opt level: O2

void __thiscall
pybind11::cpp_function::cpp_function<void,Person,std::shared_ptr<Job>const&>
          (cpp_function *this,offset_in_Job_to_subr f)

{
  type local_20;
  
  (this->super_function).super_object.super_handle.m_ptr = (PyObject *)0x0;
  local_20.f = f;
  initialize<pybind11::cpp_function::initialize<void,Person,std::shared_ptr<Job>const&>(void(Person::*)(std::shared_ptr<Job>const&))::_lambda(Person*,std::shared_ptr<Job>const&)_1_,void,Person*,std::shared_ptr<Job>const&>
            (this,&local_20,(_func_void_Person_ptr_shared_ptr<Job>_ptr *)0x0);
  return;
}

Assistant:

cpp_function(Return (Class::*f)(Arg...) PYBIND11_NOEXCEPT_SPECIFIER, const Extra&... extra) {
        initialize([f](Class *c, Arg... args) -> Return { return (c->*f)(args...); },
                   (Return (*) (Class *, Arg...) PYBIND11_NOEXCEPT_SPECIFIER) nullptr, extra...);
    }